

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_set_parameters(adios2_io *io,char *parameters)

{
  allocator local_51;
  allocator local_50 [32];
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for adios2_io, in call to adios2_set_parameters",local_50);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)local_50,parameters,&local_51);
  adios2::core::IO::SetParameters((string *)io);
  std::__cxx11::string::~string((string *)local_50);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_parameters(adios2_io *io, const char *parameters)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_set_parameters");
        reinterpret_cast<adios2::core::IO *>(io)->SetParameters(parameters);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_parameters"));
    }
}